

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O3

bean_ptr<Person> * __thiscall
hiberlite::Database::manageBean<Person>
          (bean_ptr<Person> *__return_storage_ptr__,Database *this,Person *ptr)

{
  int *piVar1;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar2;
  int iVar3;
  sqlid_t sVar4;
  bean_key local_78;
  bean_key local_60;
  string local_48;
  
  getClassName<Person>();
  sVar4 = allocId(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  psVar2 = (this->con).res;
  if (psVar2 == (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    local_78.con.res = (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0;
  }
  else {
    iVar3 = psVar2->refCount + 1;
    psVar2->refCount = iVar3;
    if (iVar3 == 0) {
      (*psVar2->_vptr_shared_cnt_obj_pair[1])(psVar2);
      iVar3 = psVar2->refCount;
    }
    psVar2->refCount = iVar3 + 1;
    local_78.con.res = psVar2;
  }
  local_78.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  local_78.id = sVar4;
  dbUpdate<Person>(&local_78,ptr);
  local_78.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  if (local_78.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &(local_78.con.res)->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_78.con.res)->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  local_60.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  if (psVar2 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    psVar2->refCount = psVar2->refCount + 1;
  }
  local_60.id = sVar4;
  local_60.con.res = psVar2;
  Registry<Person>::createBeanPtr(__return_storage_ptr__,&local_60,ptr);
  local_60.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  if (local_60.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &(local_60.con.res)->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_60.con.res)->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  if (psVar2 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &psVar2->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*psVar2->_vptr_shared_cnt_obj_pair[1])(psVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline bean_ptr<C> Database::manageBean(C* ptr)
{
	sqlid_t id=allocId( Database::getClassName<C>() );
	bean_key key(con,id);
	dbUpdate(key,*ptr);
	return Registry<C>::createBeanPtr(key,ptr);
}